

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t cmp_mexp(void *a,void *b)

{
  wchar_t local_28;
  uint16_t ib;
  uint16_t ia;
  void *b_local;
  void *a_local;
  
  if (r_info[*a].mexp < r_info[*b].mexp) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (r_info[*b].mexp < r_info[*a].mexp) {
    a_local._4_4_ = L'\x01';
  }
  else {
    if (a < b) {
      local_28 = L'\xffffffff';
    }
    else {
      local_28 = (wchar_t)(b < a);
    }
    a_local._4_4_ = local_28;
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_mexp(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (r_info[ia].mexp < r_info[ib].mexp)
		return -1;
	if (r_info[ia].mexp > r_info[ib].mexp)
		return 1;
	return (a < b ? -1 : (a > b ? 1 : 0));
}